

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

void __thiscall OutputRedirect::OutputRedirect(OutputRedirect *this,FILE *f)

{
  int __fd2;
  FILE *in_RSI;
  file *in_RDI;
  file write_end;
  int fd;
  file *in_stack_ffffffffffffffb8;
  file *pfVar1;
  file local_28;
  file local_24;
  int local_20;
  
  *(FILE **)in_RDI = in_RSI;
  pfVar1 = in_RDI + 2;
  fmt::v5::file::file(pfVar1);
  fmt::v5::file::file(in_RDI + 3);
  flush((OutputRedirect *)in_RSI);
  local_20 = fileno(in_RSI);
  fmt::v5::file::dup(&local_24,local_20);
  fmt::v5::file::operator=(pfVar1,in_stack_ffffffffffffffb8);
  fmt::v5::file::~file(in_RDI);
  pfVar1 = &local_28;
  fmt::v5::file::file(pfVar1);
  fmt::v5::file::pipe(in_RDI + 3,&pfVar1->fd_);
  fmt::v5::file::dup2(&local_28,local_20,__fd2);
  fmt::v5::file::~file(in_RDI);
  return;
}

Assistant:

OutputRedirect::OutputRedirect(FILE *f) : file_(f) {
  flush();
  int fd = FMT_POSIX(fileno(f));
  // Create a file object referring to the original file.
  original_ = file::dup(fd);
  // Create a pipe.
  file write_end;
  file::pipe(read_end_, write_end);
  // Connect the passed FILE object to the write end of the pipe.
  write_end.dup2(fd);
}